

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O0

Vec_Bit_t * Ree_CollectInsiders(Gia_Man_t *pGia,Vec_Int_t *vAdds)

{
  int iVar1;
  int iVar2;
  int i_00;
  Vec_Bit_t *p;
  Vec_Bit_t *vInsiders_00;
  int Entry3;
  int Entry2;
  int Entry1;
  int i;
  Vec_Bit_t *vInsiders;
  Vec_Bit_t *vVisited;
  Vec_Int_t *vAdds_local;
  Gia_Man_t *pGia_local;
  
  iVar1 = Gia_ManObjNum(pGia);
  p = Vec_BitStart(iVar1);
  iVar1 = Gia_ManObjNum(pGia);
  vInsiders_00 = Vec_BitStart(iVar1);
  for (Entry2 = 0; iVar1 = Vec_IntSize(vAdds), Entry2 * 6 < iVar1; Entry2 = Entry2 + 1) {
    iVar1 = Vec_IntEntry(vAdds,Entry2 * 6 + 2);
    if (iVar1 != 0) {
      iVar1 = Vec_IntEntry(vAdds,Entry2 * 6);
      iVar2 = Vec_IntEntry(vAdds,Entry2 * 6 + 1);
      i_00 = Vec_IntEntry(vAdds,Entry2 * 6 + 2);
      Vec_BitWriteEntry(p,iVar1,1);
      Vec_BitWriteEntry(p,iVar2,1);
      Vec_BitWriteEntry(p,i_00,1);
      iVar1 = Vec_IntEntry(vAdds,Entry2 * 6 + 3);
      iVar2 = Vec_IntEntry(vAdds,Entry2 * 6 + 4);
      Ree_CollectInsiders_rec(pGia,iVar1,p,vInsiders_00);
      Ree_CollectInsiders_rec(pGia,iVar2,p,vInsiders_00);
    }
  }
  Vec_BitFree(p);
  return vInsiders_00;
}

Assistant:

Vec_Bit_t * Ree_CollectInsiders( Gia_Man_t * pGia, Vec_Int_t * vAdds )
{
    Vec_Bit_t * vVisited = Vec_BitStart( Gia_ManObjNum(pGia) );
    Vec_Bit_t * vInsiders = Vec_BitStart( Gia_ManObjNum(pGia) );
    int i, Entry1, Entry2, Entry3;
    for ( i = 0; 6*i < Vec_IntSize(vAdds); i++ )
    {
        if ( Vec_IntEntry(vAdds, 6*i+2) == 0 ) // HADD
            continue;
        // mark inputs
        Entry1 = Vec_IntEntry( vAdds, 6*i + 0 );
        Entry2 = Vec_IntEntry( vAdds, 6*i + 1 );
        Entry3 = Vec_IntEntry( vAdds, 6*i + 2 );
        Vec_BitWriteEntry( vVisited, Entry1, 1 );
        Vec_BitWriteEntry( vVisited, Entry2, 1 );
        Vec_BitWriteEntry( vVisited, Entry3, 1 );
        // traverse from outputs
        Entry1 = Vec_IntEntry( vAdds, 6*i + 3 );
        Entry2 = Vec_IntEntry( vAdds, 6*i + 4 );
        Ree_CollectInsiders_rec( pGia, Entry1, vVisited, vInsiders );
        Ree_CollectInsiders_rec( pGia, Entry2, vVisited, vInsiders );
    }
    Vec_BitFree( vVisited );
    return vInsiders;
}